

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O3

void fight_prog_horde_bear(OBJ_DATA *obj,CHAR_DATA *ch)

{
  CHAR_DATA *victim;
  bool bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = is_affected(ch,(int)gsn_rage);
  if ((bVar1) && (ch->fighting != (CHAR_DATA *)0x0)) {
    iVar2 = number_percent();
    iVar3 = get_skill(ch,(int)gsn_rage);
    if ((double)iVar2 <= (double)iVar3 * 0.15) {
      act("The rage of the Bear roars through you as you charge into $N, sending $m sprawling!",ch,
          (void *)0x0,ch->fighting,3);
      act("$n gets a wild look in $s eyes, charging into you and sending you sprawling!",ch,
          (void *)0x0,ch->fighting,2);
      act("$n gets a wild look in $s eyes, charging into $N and sending $m sprawling!",ch,
          (void *)0x0,ch->fighting,1);
      WAIT_STATE(ch->fighting,0x16);
      victim = ch->fighting;
      iVar2 = dice(8,8);
      damage_new(ch,victim,iVar2,-1,1,true,false,0,1,"charge");
    }
  }
  return;
}

Assistant:

void fight_prog_horde_bear(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_affected(ch, gsn_rage) || !ch->fighting || number_percent() > (.15 * get_skill(ch, gsn_rage)))
		return;

	act("The rage of the Bear roars through you as you charge into $N, sending $m sprawling!", ch, 0, ch->fighting, TO_CHAR);
	act("$n gets a wild look in $s eyes, charging into you and sending you sprawling!", ch, 0, ch->fighting, TO_VICT);
	act("$n gets a wild look in $s eyes, charging into $N and sending $m sprawling!", ch, 0, ch->fighting, TO_NOTVICT);

	WAIT_STATE(ch->fighting, (int)(PULSE_VIOLENCE * 1.9));

	damage_new(ch, ch->fighting, dice(8, 8), TYPE_UNDEFINED, DAM_BASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "charge");
}